

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O2

bool __thiscall
cmTargetPropCommandBase::HandleArguments
          (cmTargetPropCommandBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *prop,uint flags)

{
  string *name;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  cmake *pcVar5;
  cmTarget *this_00;
  ulong uVar6;
  ulong uVar7;
  undefined4 uVar8;
  uint uVar9;
  allocator<char> local_61;
  uint local_60;
  undefined4 local_5c;
  string local_58;
  cmTarget *local_38;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)name) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"called with incorrect number of arguments",
               (allocator<char> *)&local_60);
    SetError(this,&local_58);
  }
  else {
    bVar1 = cmMakefile::IsAlias(this->Makefile,name);
    if (!bVar1) {
      pcVar5 = cmMakefile::GetCMakeInstance(this->Makefile);
      this_00 = cmGlobalGenerator::FindTarget
                          ((pcVar5->GlobalGenerator)._M_t.
                           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                           .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,false);
      this->Target = this_00;
      if (this_00 == (cmTarget *)0x0) {
        this_00 = cmMakefile::FindTargetToUse
                            (this->Makefile,
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,false);
        this->Target = this_00;
        if (this_00 == (cmTarget *)0x0) {
          (*this->_vptr_cmTargetPropCommandBase[4])
                    (this,(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
          return false;
        }
      }
      TVar4 = cmTarget::GetType(this_00);
      bVar1 = true;
      if (((((TVar4 != EXECUTABLE) &&
            (TVar4 = cmTarget::GetType(this->Target), TVar4 != STATIC_LIBRARY)) &&
           (TVar4 = cmTarget::GetType(this->Target), TVar4 != SHARED_LIBRARY)) &&
          ((TVar4 = cmTarget::GetType(this->Target), TVar4 != MODULE_LIBRARY &&
           (TVar4 = cmTarget::GetType(this->Target), TVar4 != OBJECT_LIBRARY)))) &&
         (TVar4 = cmTarget::GetType(this->Target), TVar4 != INTERFACE_LIBRARY)) {
        TVar4 = cmTarget::GetType(this->Target);
        bVar1 = TVar4 == UNKNOWN_LIBRARY;
      }
      TVar4 = cmTarget::GetType(this->Target);
      bVar2 = std::operator==(prop,"SOURCES");
      if (bVar2) {
        if (!(bool)(bVar1 | TVar4 == UTILITY)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"called with non-compilable target type",
                     (allocator<char> *)&local_60);
          SetError(this,&local_58);
          goto LAB_003414c0;
        }
      }
      else if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"called with non-compilable target type",
                   (allocator<char> *)&local_60);
        SetError(this,&local_58);
        goto LAB_003414c0;
      }
      local_60 = 1;
      uVar9 = 1;
      if (((flags & 4) == 0) ||
         (bVar1 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1,"SYSTEM"), !bVar1))
      {
        uVar8 = 0;
      }
      else {
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"called with incorrect number of arguments",&local_61);
          SetError(this,&local_58);
          goto LAB_003414c0;
        }
        local_60 = 2;
        uVar8 = (undefined4)CONCAT71((uint7)(uint3)(TVar4 >> 8),1);
        uVar9 = 2;
      }
      if (((flags & 1) == 0) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + (ulong)(uVar9 << 5)),"BEFORE"),
         !bVar1)) {
        if (((flags & 2) != 0) &&
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&(((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + (ulong)(uVar9 << 5)),"AFTER"),
           bVar1)) {
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_58,"called with incorrect number of arguments",&local_61);
            SetError(this,&local_58);
            goto LAB_003414c0;
          }
          uVar9 = uVar9 + 1;
          local_60 = uVar9;
        }
        bVar1 = false;
      }
      else {
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"called with incorrect number of arguments",&local_61);
          SetError(this,&local_58);
          goto LAB_003414c0;
        }
        uVar9 = uVar9 + 1;
        bVar1 = true;
        local_60 = uVar9;
      }
      local_5c = uVar8;
      if ((flags & 8) != 0) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                         ._M_p + (ulong)(uVar9 << 5)),"REUSE_FROM");
        if (bVar2) {
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start != 0x60) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_58,"called with incorrect number of arguments",&local_61);
            SetError(this,&local_58);
            goto LAB_003414c0;
          }
          local_38 = this->Target;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"PRECOMPILE_HEADERS_REUSE_FROM",&local_61);
          cmTarget::SetProperty
                    (local_38,&local_58,
                     (string *)
                     ((long)&(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p +
                     (ulong)(uVar9 << 5)));
          std::__cxx11::string::~string((string *)&local_58);
          local_60 = uVar9 + 2;
        }
      }
      std::__cxx11::string::_M_assign((string *)&this->Property);
      bVar2 = local_5c._0_1_;
      do {
        uVar6 = (ulong)local_60;
        uVar7 = (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5;
        if (uVar7 <= uVar6) {
          return uVar7 <= uVar6;
        }
        bVar3 = ProcessContentArgs(this,args,&local_60,bVar1,bVar2);
      } while (bVar3);
      return uVar7 <= uVar6;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"can not be used on an ALIAS target.",
               (allocator<char> *)&local_60);
    SetError(this,&local_58);
  }
LAB_003414c0:
  std::__cxx11::string::~string((string *)&local_58);
  return false;
}

Assistant:

bool cmTargetPropCommandBase::HandleArguments(
  std::vector<std::string> const& args, const std::string& prop,
  unsigned int flags)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  if (this->Makefile->IsAlias(args[0])) {
    this->SetError("can not be used on an ALIAS target.");
    return false;
  }
  // Lookup the target for which property-values are specified.
  this->Target =
    this->Makefile->GetCMakeInstance()->GetGlobalGenerator()->FindTarget(
      args[0]);
  if (!this->Target) {
    this->Target = this->Makefile->FindTargetToUse(args[0]);
  }
  if (!this->Target) {
    this->HandleMissingTarget(args[0]);
    return false;
  }
  const bool isRegularTarget =
    (this->Target->GetType() == cmStateEnums::EXECUTABLE) ||
    (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY) ||
    (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY) ||
    (this->Target->GetType() == cmStateEnums::MODULE_LIBRARY) ||
    (this->Target->GetType() == cmStateEnums::OBJECT_LIBRARY) ||
    (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) ||
    (this->Target->GetType() == cmStateEnums::UNKNOWN_LIBRARY);
  const bool isCustomTarget = this->Target->GetType() == cmStateEnums::UTILITY;

  if (prop == "SOURCES") {
    if (!isRegularTarget && !isCustomTarget) {
      this->SetError("called with non-compilable target type");
      return false;
    }
  } else {
    if (!isRegularTarget) {
      this->SetError("called with non-compilable target type");
      return false;
    }
  }

  bool system = false;
  unsigned int argIndex = 1;

  if ((flags & PROCESS_SYSTEM) && args[argIndex] == "SYSTEM") {
    if (args.size() < 3) {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
    system = true;
    ++argIndex;
  }

  bool prepend = false;
  if ((flags & PROCESS_BEFORE) && args[argIndex] == "BEFORE") {
    if (args.size() < 3) {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
    prepend = true;
    ++argIndex;
  } else if ((flags & PROCESS_AFTER) && args[argIndex] == "AFTER") {
    if (args.size() < 3) {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
    prepend = false;
    ++argIndex;
  }

  if ((flags & PROCESS_REUSE_FROM) && args[argIndex] == "REUSE_FROM") {
    if (args.size() != 3) {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
    ++argIndex;

    this->Target->SetProperty("PRECOMPILE_HEADERS_REUSE_FROM", args[argIndex]);
    ++argIndex;
  }

  this->Property = prop;

  while (argIndex < args.size()) {
    if (!this->ProcessContentArgs(args, argIndex, prepend, system)) {
      return false;
    }
  }
  return true;
}